

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::DescribeDefaultActionTo
          (FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
           *this,ArgumentTuple *args,ostream *os)

{
  OnCallSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pOVar1;
  ostream *poVar2;
  int in_ECX;
  string local_30;
  
  pOVar1 = FindOnCallSpec(this,args);
  if (pOVar1 != (OnCallSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                 *)0x0) {
    poVar2 = std::operator<<(os,"taking default action specified at:\n");
    FormatFileLocation_abi_cxx11_
              (&local_30,*(internal **)pOVar1,(char *)(ulong)*(uint *)(pOVar1 + 8),in_ECX);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  std::operator<<(os,"returning default value.\n");
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == nullptr) {
      *os << (std::is_void<Result>::value ? "returning directly.\n"
                                          : "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }